

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O3

void __thiscall
Database_GetEndPastLogicalEOF_Test::~Database_GetEndPastLogicalEOF_Test
          (Database_GetEndPastLogicalEOF_Test *this)

{
  (this->super_Database).super_Test._vptr_Test = (_func_int **)&PTR__Database_0026a450;
  in_memory_store::~in_memory_store(&(this->super_Database).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (Database, GetEndPastLogicalEOF) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    auto const addr = pstore::address::null ();
    std::size_t size = db.size () + 1;
    check_for_error ([&db, addr, size] () { db.getro (addr, size); },
                     pstore::error_code::bad_address);
    check_for_error ([&db, addr, size] () { db.getrou (addr, size); },
                     pstore::error_code::bad_address);
}